

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_path.c
# Opt level: O0

t_namelist * namelist_append_files(t_namelist *listwas,char *s)

{
  t_namelist *local_410;
  t_namelist *nl;
  char temp [1000];
  char *npos;
  char *s_local;
  t_namelist *listwas_local;
  
  local_410 = listwas;
  temp._992_8_ = s;
  do {
    temp._992_8_ = strtokcpy((char *)&nl,1000,(char *)temp._992_8_,':');
    if ((char)nl != '\0') {
      local_410 = namelist_append(local_410,(char *)&nl,0);
    }
  } while (temp._992_8_ != 0);
  return local_410;
}

Assistant:

t_namelist *namelist_append_files(t_namelist *listwas, const char *s)
{
    const char *npos;
    char temp[MAXPDSTRING];
    t_namelist *nl = listwas;

    npos = s;
    do
    {
        npos = strtokcpy(temp, sizeof(temp), npos, SEPARATOR);
        if (! *temp) continue;
        nl = namelist_append(nl, temp, 0);
    }
        while (npos);
    return (nl);
}